

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O1

int remoteConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_named_traits *pmVar2;
  mpt_type_t mVar3;
  mpt_convertable *pmVar4;
  
  pmVar2 = mpt_input_type_traits();
  if (pmVar2 == (mpt_named_traits *)0x0) {
    mVar3 = 0x100;
LAB_0010414c:
    if ((long)type < 0x83) {
      if (type == 0) {
        if (ptr != (void *)0x0) {
          *(uint8_t **)ptr = remoteConv::fmt;
        }
      }
      else if (type == 1) {
        if (ptr != (void *)0x0) {
          iVar1 = *(int *)&val[6]._vptr;
          if (iVar1 < 0) {
            if ((mpt_streaminfo *)val[5]._vptr == (mpt_streaminfo *)0x0) {
              iVar1 = -1;
            }
            else {
              iVar1 = _mpt_stream_fread((mpt_streaminfo *)val[5]._vptr);
            }
          }
          *(int *)ptr = iVar1;
        }
      }
      else {
        if (type != 0x81) {
          return -3;
        }
        if (ptr != (void *)0x0) {
          pmVar4 = val + 3;
          goto LAB_001041e9;
        }
      }
    }
    else if (type == 0x83) {
      if (ptr != (void *)0x0) {
        pmVar4 = val + 2;
LAB_001041e9:
        *(mpt_convertable **)ptr = pmVar4;
      }
    }
    else {
      if (type != 0x84) {
        if (type != 0x100) {
          return -3;
        }
        goto LAB_00104198;
      }
      if (ptr != (void *)0x0) {
        pmVar4 = val + 1;
        goto LAB_001041e9;
      }
    }
    iVar1 = (int)mVar3;
  }
  else {
    mVar3 = pmVar2->type;
    if (mVar3 != type) goto LAB_0010414c;
LAB_00104198:
    iVar1 = 1;
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val;
    }
  }
  return iVar1;
}

Assistant:

static int remoteConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	const MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, val, _in);
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((const void **) ptr) = &od->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const uint8_t fmt[] = {
			MPT_ENUM(TypeObjectPtr),
			MPT_ENUM(TypeOutputPtr),
			MPT_ENUM(TypeLoggerPtr),
			0
		};
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
		}
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((const void **) ptr) = &od->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((int *) ptr) = remote_infile(od);
		return me;
	}
	if (type == MPT_ENUM(TypeObjectPtr)) {
		if (ptr) *((const void **) ptr) = &od->_obj;
		return me;
	}
	if (type == MPT_ENUM(TypeOutputPtr)) {
		if (ptr) *((const void **) ptr) = &od->_out;
		return me;
	}
	if (type == MPT_ENUM(TypeLoggerPtr)) {
		if (ptr) *((const void **) ptr) = &od->_log;
		return me;
	}
	return MPT_ERROR(BadType);
}